

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvram.cpp
# Opt level: O0

QString * nvarAttributesToUString(QString *__return_storage_ptr__,UINT8 attributes)

{
  QString local_e8;
  QString local_d0;
  QString local_b8;
  QString local_a0;
  QString local_88;
  QString local_70;
  QString local_58;
  QString local_30;
  undefined1 local_12;
  byte local_11;
  QString *pQStack_10;
  UINT8 attributes_local;
  QString *str;
  
  local_11 = attributes;
  pQStack_10 = __return_storage_ptr__;
  if ((attributes == '\0') || (attributes == 0xff)) {
    QString::QString(__return_storage_ptr__);
  }
  else {
    local_12 = 0;
    QString::QString(__return_storage_ptr__);
    if ((local_11 & 1) != 0) {
      QString::QString(&local_30,", Runtime");
      QString::operator+=(__return_storage_ptr__,&local_30);
      QString::~QString(&local_30);
    }
    if ((local_11 & 2) != 0) {
      QString::QString(&local_58,", AsciiName");
      QString::operator+=(__return_storage_ptr__,&local_58);
      QString::~QString(&local_58);
    }
    if ((local_11 & 4) != 0) {
      QString::QString(&local_70,", Guid");
      QString::operator+=(__return_storage_ptr__,&local_70);
      QString::~QString(&local_70);
    }
    if ((local_11 & 8) != 0) {
      QString::QString(&local_88,", DataOnly");
      QString::operator+=(__return_storage_ptr__,&local_88);
      QString::~QString(&local_88);
    }
    if ((local_11 & 0x10) != 0) {
      QString::QString(&local_a0,", ExtHeader");
      QString::operator+=(__return_storage_ptr__,&local_a0);
      QString::~QString(&local_a0);
    }
    if ((local_11 & 0x20) != 0) {
      QString::QString(&local_b8,", HwErrorRecord");
      QString::operator+=(__return_storage_ptr__,&local_b8);
      QString::~QString(&local_b8);
    }
    if ((local_11 & 0x40) != 0) {
      QString::QString(&local_d0,", AuthWrite");
      QString::operator+=(__return_storage_ptr__,&local_d0);
      QString::~QString(&local_d0);
    }
    if ((local_11 & 0x80) != 0) {
      QString::QString(&local_e8,", Valid");
      QString::operator+=(__return_storage_ptr__,&local_e8);
      QString::~QString(&local_e8);
    }
    QString::remove((longlong)__return_storage_ptr__,0);
  }
  return __return_storage_ptr__;
}

Assistant:

UString nvarAttributesToUString(const UINT8 attributes)
{
    if (attributes == 0x00 || attributes == 0xFF)
        return UString();
    
    UString str;
    if (attributes & NVRAM_NVAR_ENTRY_RUNTIME)         str += UString(", Runtime");
    if (attributes & NVRAM_NVAR_ENTRY_ASCII_NAME)      str += UString(", AsciiName");
    if (attributes & NVRAM_NVAR_ENTRY_GUID)            str += UString(", Guid");
    if (attributes & NVRAM_NVAR_ENTRY_DATA_ONLY)       str += UString(", DataOnly");
    if (attributes & NVRAM_NVAR_ENTRY_EXT_HEADER)      str += UString(", ExtHeader");
    if (attributes & NVRAM_NVAR_ENTRY_HW_ERROR_RECORD) str += UString(", HwErrorRecord");
    if (attributes & NVRAM_NVAR_ENTRY_AUTH_WRITE)      str += UString(", AuthWrite");
    if (attributes & NVRAM_NVAR_ENTRY_VALID)           str += UString(", Valid");
    
    str.remove(0, 2); // Remove first comma and space
    return str;
}